

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_deserializer.cpp
# Opt level: O0

VoidConstPtr __thiscall miniros::MessageDeserializer::deserialize(MessageDeserializer *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  element_type *peVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  VoidConstPtr VVar6;
  bool enabled;
  exception *e;
  SubscriptionCallbackHelperDeserializeParams params;
  scoped_lock<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffeb8;
  shared_ptr<const_void> *in_stack_fffffffffffffec0;
  __shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffed0;
  undefined1 local_50 [16];
  undefined8 local_40;
  int local_38;
  undefined4 local_1c;
  
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x80));
  if (bVar3) {
    std::shared_ptr<const_void>::shared_ptr
              (in_stack_fffffffffffffec0,(shared_ptr<const_void> *)in_stack_fffffffffffffeb8);
  }
  else {
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x30));
    if (bVar3) {
      std::shared_ptr<const_void>::operator=
                (in_stack_fffffffffffffec0,(shared_ptr<const_void> *)in_stack_fffffffffffffeb8);
      std::shared_ptr<const_void>::shared_ptr
                (in_stack_fffffffffffffec0,(shared_ptr<const_void> *)in_stack_fffffffffffffeb8);
    }
    else {
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x10));
      if ((bVar3) || (*(long *)(in_RSI + 0x20) == 0)) {
        SubscriptionCallbackHelperDeserializeParams::SubscriptionCallbackHelperDeserializeParams
                  ((SubscriptionCallbackHelperDeserializeParams *)0x47088e);
        local_40 = *(undefined8 *)(in_RSI + 0x28);
        iVar1 = *(int *)(in_RSI + 0x20);
        iVar2 = *(int *)(in_RSI + 0x28);
        peVar4 = std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)
                            (in_RSI + 0x10));
        local_38 = iVar1 + ((int)peVar4 - iVar2);
        std::
        shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator=((shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)in_stack_fffffffffffffec0,
                    (shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)in_stack_fffffffffffffeb8);
        peVar5 = std::
                 __shared_ptr_access<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4708f8);
        (*peVar5->_vptr_SubscriptionCallbackHelper[2])(local_50,peVar5,&local_40);
        std::shared_ptr<const_void>::operator=
                  (in_stack_fffffffffffffec0,(shared_ptr<const_void> *)in_stack_fffffffffffffeb8);
        std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)0x47093c);
        SubscriptionCallbackHelperDeserializeParams::~SubscriptionCallbackHelperDeserializeParams
                  ((SubscriptionCallbackHelperDeserializeParams *)0x470949);
        std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::reset
                  (in_stack_fffffffffffffed0);
        std::shared_ptr<const_void>::shared_ptr
                  (in_stack_fffffffffffffec0,(shared_ptr<const_void> *)in_stack_fffffffffffffeb8);
      }
      else {
        std::shared_ptr<const_void>::shared_ptr((shared_ptr<const_void> *)0x47086c);
      }
    }
  }
  local_1c = 1;
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x470ca4);
  VVar6.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  VVar6.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (VoidConstPtr)VVar6.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VoidConstPtr MessageDeserializer::deserialize()
{
  std::scoped_lock<std::mutex> lock(mutex_);

  if (msg_)
  {
    return msg_;
  }

  if (serialized_message_.message)
  {
    msg_ = serialized_message_.message;
    return msg_;
  }

  if (!serialized_message_.buf && serialized_message_.num_bytes > 0)
  {
    // If the buffer has been reset it means we tried to deserialize and failed
    return VoidConstPtr();
  }

  try
  {
    SubscriptionCallbackHelperDeserializeParams params;
    params.buffer = serialized_message_.message_start;
    params.length = serialized_message_.num_bytes - (serialized_message_.message_start - serialized_message_.buf.get());
    params.connection_header = connection_header_;
    msg_ = helper_->deserialize(params);
  }
  catch (std::exception& e)
  {
    MINIROS_ERROR("Exception thrown when deserializing message of length [%d] from [%s]: %s", (uint32_t)serialized_message_.num_bytes, (*connection_header_)["callerid"].c_str(), e.what());
  }

  serialized_message_.buf.reset();

  return msg_;
}